

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

ostream * __thiscall foxxll::request::print(request *this,ostream *out)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *out_local;
  request *this_local;
  
  poVar1 = std::operator<<(out,"File object address: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->file_);
  poVar1 = std::operator<<(poVar1," Buffer address: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->buffer_);
  poVar1 = std::operator<<(poVar1," File offset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->offset_);
  poVar1 = std::operator<<(poVar1," Transfer size: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bytes_);
  poVar1 = std::operator<<(poVar1," bytes Type of transfer: ");
  pcVar2 = "WRITE";
  if (this->op_ == READ) {
    pcVar2 = "READ";
  }
  std::operator<<(poVar1,pcVar2);
  return out;
}

Assistant:

std::ostream& request::print(std::ostream& out) const
{
    out << "File object address: " << file_
        << " Buffer address: " << static_cast<void*>(buffer_)
        << " File offset: " << offset_
        << " Transfer size: " << bytes_ << " bytes"
        " Type of transfer: " << ((op_ == READ) ? "READ" : "WRITE");
    return out;
}